

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

int __thiscall Epoll::poll(Epoll *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  int __epfd;
  uint uVar1;
  epoll_event *__events;
  size_type sVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_> local_20
  ;
  int local_14;
  Epoll *pEStack_10;
  int event_count;
  Epoll *this_local;
  
  pEStack_10 = this;
  while( true ) {
    __epfd = this->ep_epoll_fd;
    local_20._M_current =
         (epoll_event *)
         std::vector<epoll_event,_std::allocator<epoll_event>_>::begin(&this->ep_events);
    __events = (epoll_event *)
               __gnu_cxx::
               __normal_iterator<epoll_event_*,_std::vector<epoll_event,_std::allocator<epoll_event>_>_>
               ::operator*(&local_20);
    sVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::size(&this->ep_events);
    local_14 = epoll_wait(__epfd,__events,(int)sVar2,20000);
    if (-1 < local_14) break;
    if (-1 < pr_level) {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      printf("[%-5s][%s:%d] epoll wait return val <0! error no:%d, error str:%s\n","error","poll",
             0x5c,(ulong)uVar1,pcVar5);
    }
  }
  execute_cbs(this,local_14);
  return local_14;
}

Assistant:

int Epoll::poll() {
    while (true) {
        int event_count =
            epoll_wait(ep_epoll_fd, &*ep_events.begin(), ep_events.size(), EPOLLWAIT_TIME);
        if (event_count < 0)
        {
            PR_ERROR("epoll wait return val <0! error no:%d, error str:%s\n", errno, strerror(errno));
            continue;
        }

        execute_cbs(event_count);
        return event_count;
    }
}